

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

ptrdiff_t mp_check_uint(char *cur,char *end)

{
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x89b,"ptrdiff_t mp_check_uint(const char *, const char *)");
  }
  if (mp_type_hint[(byte)*cur] == MP_UINT) {
    return (ptrdiff_t)(cur + ((long)""[(byte)*cur] - (long)end) + 1);
  }
  __assert_fail("mp_typeof(*cur) == MP_UINT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x89c,"ptrdiff_t mp_check_uint(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_uint(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_UINT);
	uint8_t c = mp_load_u8(&cur);
	return mp_parser_hint[c] - (end - cur);
}